

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void uprops_addPropertyStarts_63(UPropertySource src,USetAdder *sa,UErrorCode *pErrorCode)

{
  int iVar1;
  UChar32 UVar2;
  int start;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (src - UPROPS_SRC_INPC < 3) {
    iVar1 = *(int *)(&DAT_0032acd0 + (ulong)(src - UPROPS_SRC_INPC) * 4);
    start = 0;
    while( true ) {
      UVar2 = ucptrie_getRange_63((UCPTrie *)(&DAT_0032acd0 + iVar1),start,UCPMAP_RANGE_NORMAL,0,
                                  (UCPMapValueFilter *)0x0,(void *)0x0,(uint32_t *)0x0);
      if (UVar2 < 0) break;
      (*(code *)sa->add)(sa->set,start);
      start = UVar2 + 1;
    }
    return;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }